

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_exif(spng_ctx *ctx,spng_exif *exif)

{
  int iVar1;
  int ret;
  spng_exif *exif_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (exif == (spng_exif *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      iVar1 = check_exif(exif);
      if (iVar1 == 0) {
        if (((ctx->exif).data != (char *)0x0) && (((uint)ctx->user >> 0xf & 1) == 0)) {
          spng__free(ctx,(ctx->exif).data);
        }
        (ctx->exif).length = exif->length;
        (ctx->exif).data = exif->data;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xffff7fff | 0x8000);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xffff7fff | 0x8000);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x3d;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_exif(spng_ctx *ctx, struct spng_exif *exif)
{
    SPNG_SET_CHUNK_BOILERPLATE(exif);

    if(check_exif(exif)) return SPNG_EEXIF;

    if(ctx->exif.data != NULL && !ctx->user.exif) spng__free(ctx, ctx->exif.data);

    ctx->exif = *exif;

    ctx->stored.exif = 1;
    ctx->user.exif = 1;

    return 0;
}